

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int av1_write_uleb_obu_size_unsafe(size_t obu_payload_size,uint8_t *dest)

{
  int iVar1;
  size_t *in_RDI;
  size_t unaff_retaddr;
  size_t coded_obu_size;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = aom_uleb_encode(coded_obu_size,unaff_retaddr,
                          (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI);
  return (uint)(iVar1 != 0);
}

Assistant:

static int av1_write_uleb_obu_size_unsafe(size_t obu_payload_size,
                                          uint8_t *dest) {
  size_t coded_obu_size = 0;

  if (aom_uleb_encode(obu_payload_size, sizeof(uint32_t), dest,
                      &coded_obu_size) != 0) {
    return AOM_CODEC_ERROR;
  }

  return AOM_CODEC_OK;
}